

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

int GmfSetBlock(int64_t MshIdx,int KwdCod,int64_t BegIdx,int64_t EndIdx,int MapTyp,void *MapTab,
               void *prc,...)

{
  __jmp_buf_tag *__env;
  long lVar1;
  ulong uVar2;
  char in_AL;
  int iVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  double *__ptr;
  double *__ptr_00;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  code *pcVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  double *pdVar18;
  uint uVar19;
  FILE *__stream;
  int iVar20;
  double dVar21;
  ulong uVar22;
  double *pdVar23;
  long lVar24;
  void *pvVar25;
  uint *puVar26;
  bool bVar27;
  undefined4 in_XMM0_Da;
  float fVar28;
  undefined4 uVar29;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  code *in_stack_00000010;
  aiocb aio;
  int UsrTyp [1000];
  char *UsrDat [1000];
  int FilTyp [1000];
  size_t UsrLen [1000];
  char *UsrBas [1000];
  uint *local_7ef0;
  aiocb local_7e68;
  ulong local_7e40;
  ulong local_7e38;
  ulong local_7e30;
  ulong local_7e28;
  uint *local_7e20;
  uint *local_7e18;
  uint *local_7e10;
  ulong local_7e08;
  long local_7e00;
  uint *local_7df8;
  int64_t local_7df0;
  uint local_7de8 [12];
  undefined4 local_7db8;
  undefined8 local_7da8;
  undefined8 local_7d98;
  undefined8 local_7d88;
  undefined8 local_7d78;
  undefined8 local_7d68;
  undefined8 local_7d58;
  undefined8 local_7d48;
  uint local_7d38 [1000];
  long local_6d98 [1000];
  uint auStack_4e58 [1000];
  ulong local_3eb8 [1000];
  long local_1f78 [1001];
  
  iVar20 = (int)_KwdCod;
  if (in_AL != '\0') {
    local_7db8 = in_XMM0_Da;
    local_7da8 = in_XMM1_Qa;
    local_7d98 = in_XMM2_Qa;
    local_7d88 = in_XMM3_Qa;
    local_7d78 = in_XMM4_Qa;
    local_7d68 = in_XMM5_Qa;
    local_7d58 = in_XMM6_Qa;
    local_7d48 = in_XMM7_Qa;
  }
  __env = (__jmp_buf_tag *)(MshIdx + 0x48);
  iVar3 = _setjmp(__env);
  uVar19 = iVar20 - 0xf1;
  local_7e18 = (uint *)(ulong)uVar19;
  iVar8 = 0;
  if ((0xffffff0f < uVar19) && (iVar3 == 0)) {
    lVar1 = MshIdx + (long)iVar20 * 0x3300;
    puVar26 = (uint *)(lVar1 + 0x110);
    uVar2 = *(ulong *)(lVar1 + 0x10d8);
    if ((uVar2 != 0) && (iVar8 = 0, (*puVar26 & 0xfffffffe) == 2)) {
      pvVar10 = (void *)0x0;
      pvVar25 = MapTab;
      if ((MapTyp != 10) && (pvVar25 = (void *)0x0, pvVar10 = MapTab, MapTyp != 0xb)) {
        pvVar10 = pvVar25;
      }
      local_7ef0 = (uint *)&stack0x00000010;
      if (prc == (void *)0x0) {
        prc = (code *)0x0;
        pcVar11 = (code *)prc;
      }
      else {
        local_7e18 = (uint *)&stack0x00000018;
        pcVar11 = in_stack_00000010;
        local_7ef0 = local_7e18;
      }
      if ((*puVar26 & 0xfffffffe) != 2) {
        longjmp(__env,-0x2a);
      }
      local_7e10 = local_7ef0 + 2;
      uVar19 = *local_7ef0;
      local_7e20 = local_7ef0;
      puVar5 = local_7e10;
      if (uVar19 == 100) {
        local_7e20 = *(uint **)local_7e10;
        local_7e18 = *(uint **)(local_7ef0 + 4);
        _KwdCod = *(long *)(local_7ef0 + 6);
        local_7e10 = *(uint **)(local_7ef0 + 8);
        puVar5 = local_7ef0 + 10;
      }
      local_7ef0 = puVar5;
      uVar12 = 0x30;
      uVar15 = *(uint *)(lVar1 + 0x11c);
      if (0 < (int)uVar15) {
        local_7e28 = uVar2 - 1;
        bVar27 = true;
        iVar20 = 0;
        iVar8 = 0;
        uVar9 = uVar19;
        do {
          if (uVar19 == 100) {
            lVar4 = (long)iVar8;
            uVar9 = local_7e20[lVar4];
            if ((uVar9 & 0xfffffffc) == 0xc) {
              uVar9 = uVar9 - 4;
              uVar15 = local_7e18[lVar4];
            }
            else {
              uVar15 = 1;
              if (uVar9 - 1 < 4) {
                uVar15 = *(uint *)(MshIdx + 0x1c + (ulong)uVar9 * 4);
                uVar9 = *(int *)(MshIdx + 4) == 1 ^ 9;
              }
            }
            lVar24 = *(long *)(_KwdCod + lVar4 * 8);
            puVar5 = local_7e10 + lVar4 * 2;
            iVar8 = iVar8 + 1;
          }
          else {
            if (!bVar27) {
              uVar6 = (ulong)uVar12;
              if (uVar6 < 0x29) {
                uVar12 = uVar12 + 8;
                puVar5 = (uint *)((long)local_7de8 + uVar6);
              }
              else {
                puVar5 = local_7ef0;
                local_7ef0 = local_7ef0 + 2;
              }
              uVar9 = *puVar5;
            }
            if ((uVar9 & 0xfffffffc) == 0xc) {
              uVar6 = (ulong)uVar12;
              if (uVar6 < 0x29) {
                uVar12 = uVar12 + 8;
                puVar5 = (uint *)((long)local_7de8 + uVar6);
              }
              else {
                puVar5 = local_7ef0;
                local_7ef0 = local_7ef0 + 2;
              }
              uVar9 = uVar9 - 4;
              uVar15 = *puVar5;
            }
            else {
              uVar15 = 1;
              if (uVar9 - 1 < 4) {
                uVar15 = *(uint *)(MshIdx + 0x1c + (ulong)uVar9 * 4);
                uVar9 = *(int *)(MshIdx + 4) == 1 ^ 9;
              }
            }
            uVar6 = (ulong)uVar12;
            if (uVar6 < 0x29) {
              uVar12 = uVar12 + 8;
              puVar5 = (uint *)((long)local_7de8 + uVar6);
            }
            else {
              puVar5 = local_7ef0;
              local_7ef0 = local_7ef0 + 2;
            }
            lVar24 = *(long *)puVar5;
            uVar6 = (ulong)uVar12;
            if (uVar6 < 0x29) {
              uVar12 = uVar12 + 8;
              puVar5 = (uint *)((long)local_7de8 + uVar6);
            }
            else {
              puVar5 = local_7ef0;
              local_7ef0 = local_7ef0 + 2;
            }
            bVar27 = false;
          }
          if ((long)uVar2 < 2) {
            uVar6 = 0;
          }
          else {
            uVar6 = (ulong)(*(long *)puVar5 - lVar24) / local_7e28;
          }
          if (0 < (int)uVar15) {
            iVar3 = *(int *)(&DAT_0010f980 + (long)(int)uVar9 * 4);
            uVar16 = 0;
            do {
              local_7d38[(long)iVar20 + uVar16] = uVar9;
              local_1f78[(long)iVar20 + uVar16] = lVar24;
              local_6d98[(long)iVar20 + uVar16] = lVar24;
              local_3eb8[(long)iVar20 + uVar16] = uVar6;
              uVar16 = uVar16 + 1;
              lVar24 = lVar24 + iVar3;
            } while (uVar15 != uVar16);
            iVar20 = iVar20 + (int)uVar16;
          }
          uVar15 = *(uint *)(lVar1 + 0x11c);
          local_7df8 = puVar26;
          local_7df0 = MshIdx;
        } while (iVar20 < (int)uVar15);
      }
      if ((int)uVar15 < 1) {
        uVar6 = 0;
      }
      else {
        uVar16 = 0;
        uVar6 = uVar16;
        do {
          if (*(char *)(lVar1 + 0x10e8 + uVar16) == 'r') {
            uVar19 = *(int *)(MshIdx + 0x18) == 0x20 ^ 9;
          }
          else {
            uVar19 = *(int *)(MshIdx + 4) < 4 ^ 0xb;
          }
          auStack_4e58[uVar16] = uVar19;
          uVar6 = uVar6 + (long)*(int *)(&DAT_0010f9a0 + (ulong)(uVar19 - 8) * 4);
          uVar16 = uVar16 + 1;
        } while (uVar15 != uVar16);
      }
      local_7e00 = _KwdCod;
      if ((*(byte *)(MshIdx + 0xc) & 1) == 0) {
        __ptr = (double *)malloc(uVar6 * 10000);
        if (__ptr == (double *)0x0) {
          longjmp(__env,-0x2b);
        }
        local_7e08 = uVar6;
        __ptr_00 = (double *)malloc(uVar6 * 10000);
        if (__ptr_00 == (double *)0x0) {
          longjmp(__env,-0x2c);
        }
        local_7e68.aio_buf = (double *)0x0;
        local_7e68.aio_nbytes = 0;
        local_7e68.aio_offset = 0;
        local_7e68.aio_lio_opcode = 0;
        local_7e68._36_4_ = 0;
        local_7e68.aio_fildes = *(FILE **)(MshIdx + 0x300410);
        local_7e68.aio_offset = ftell((FILE *)local_7e68.aio_fildes);
        lVar4 = -((long)uVar2 >> 0x3f);
        lVar24 = (long)uVar2 / 10000 + ((long)uVar2 >> 0x3f);
        local_7e30 = lVar24 + lVar4;
        local_7e38 = lVar24 + lVar4 + 1;
        uVar16 = 0;
        uVar6 = uVar16;
        uVar14 = uVar16;
        pdVar18 = __ptr;
        uVar22 = uVar16;
        do {
          if (uVar22 != 0) {
            local_7e68.aio_nbytes = uVar14 * local_7e08;
            local_7e40 = uVar16;
            iVar20 = my_aio_write(&local_7e68);
            uVar16 = local_7e40;
            if (iVar20 == -1) {
              printf("aio_fildes = %p\n",local_7e68.aio_fildes);
              printf("aio_buf    = %p\n",local_7e68.aio_buf);
              printf("aio_offset = %ld\n",local_7e68.aio_offset);
              printf("aio_nbytes = %ld\n",local_7e68.aio_nbytes);
              puVar26 = (uint *)__errno_location();
              printf("errno      = %d\n",(ulong)*puVar26);
              longjmp(__env,-0x2d);
            }
          }
          if (uVar22 <= local_7e30) {
            uVar14 = uVar22 * -10000 + uVar2;
            if (uVar22 != local_7e30) {
              uVar14 = 10000;
            }
            uVar13 = uVar14 + uVar16;
            if ((code *)prc != (code *)0x0) {
              (*(code *)prc)(uVar16 + 1,uVar13,pcVar11);
            }
            uVar16 = uVar13;
            if (0 < (long)uVar14) {
              uVar17 = 0;
              uVar13 = uVar6;
              pdVar23 = pdVar18;
              do {
                uVar6 = uVar13 + 1;
                if (0 < *(int *)(lVar1 + 0x11c)) {
                  lVar24 = 0;
                  do {
                    if (pvVar25 == (void *)0x0) {
                      if (pvVar10 != (void *)0x0) {
                        lVar4 = *(long *)((long)pvVar10 + uVar6 * 8);
                        goto LAB_0010d687;
                      }
                      lVar4 = local_3eb8[lVar24] * uVar13;
                    }
                    else {
                      lVar4 = (long)*(int *)((long)pvVar25 + uVar6 * 4);
LAB_0010d687:
                      lVar4 = (lVar4 + -1) * local_3eb8[lVar24];
                    }
                    local_6d98[lVar24] = lVar4 + local_1f78[lVar24];
                    switch(auStack_4e58[lVar24]) {
                    case 8:
                      if (local_7d38[lVar24] == 8) {
                        fVar28 = *(float *)local_6d98[lVar24];
                      }
                      else {
                        fVar28 = (float)*(double *)local_6d98[lVar24];
                      }
                      *(float *)pdVar23 = fVar28;
                      break;
                    case 9:
                      if (local_7d38[lVar24] == 9) {
                        dVar21 = *(double *)local_6d98[lVar24];
                      }
                      else {
                        dVar21 = (double)*(float *)local_6d98[lVar24];
                      }
                      *pdVar23 = dVar21;
                      break;
                    case 10:
                      *(undefined4 *)pdVar23 = *(undefined4 *)local_6d98[lVar24];
                      break;
                    case 0xb:
                      if (local_7d38[lVar24] == 0xb) {
                        dVar21 = *(double *)local_6d98[lVar24];
                      }
                      else {
                        dVar21 = (double)(long)*(int *)local_6d98[lVar24];
                      }
                      *pdVar23 = dVar21;
                    }
                    pdVar23 = (double *)
                              ((long)pdVar23 +
                              (long)*(int *)(&DAT_0010f980 + (long)(int)auStack_4e58[lVar24] * 4));
                    lVar24 = lVar24 + 1;
                  } while (lVar24 < *(int *)(lVar1 + 0x11c));
                }
                uVar17 = uVar17 + 1;
                uVar13 = uVar6;
              } while (uVar17 != uVar14);
            }
          }
          if (uVar22 != 0) {
            if (local_7e68.aio_lio_opcode != 0) {
              if (local_7e68.aio_lio_opcode != 0x73) {
                pcVar7 = strerror(local_7e68.aio_lio_opcode);
                printf(" Error at aio_error() : %s\n",pcVar7);
                longjmp(__env,-0x2e);
              }
              do {
              } while( true );
            }
            local_7e68.aio_offset = local_7e68.aio_offset + local_7e68.aio_nbytes;
          }
          bVar27 = pdVar18 != __ptr;
          pdVar18 = __ptr_00;
          local_7e68.aio_buf = __ptr;
          if (bVar27) {
            pdVar18 = __ptr;
            local_7e68.aio_buf = __ptr_00;
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 <= local_7e38);
        fseek(*(FILE **)(MshIdx + 0x300410),local_7e68.aio_offset,0);
        free(__ptr);
        free(__ptr_00);
      }
      else {
        if ((code *)prc != (code *)0x0) {
          (*(code *)prc)(1,*(undefined8 *)(lVar1 + 0x10d8),pcVar11);
        }
        uVar6 = 1;
        do {
          if (0 < *(int *)(lVar1 + 0x11c)) {
            lVar24 = 0;
            do {
              switch(local_7d38[lVar24]) {
              case 8:
                __stream = *(FILE **)(MshIdx + 0x300410);
                uVar29 = SUB84((double)*(float *)local_6d98[lVar24],0);
                pcVar7 = "%.9g";
                goto LAB_0010d91b;
              case 9:
                __stream = *(FILE **)(MshIdx + 0x300410);
                uVar29 = (undefined4)*(undefined8 *)local_6d98[lVar24];
                pcVar7 = "%.17g";
LAB_0010d91b:
                fprintf(__stream,pcVar7,uVar29);
                break;
              case 10:
                fprintf(*(FILE **)(MshIdx + 0x300410),"%d",(ulong)*(uint *)local_6d98[lVar24]);
                break;
              case 0xb:
                fprintf(*(FILE **)(MshIdx + 0x300410),"%lld",*(undefined8 *)local_6d98[lVar24]);
              }
              iVar20 = 10;
              if (lVar24 < (long)*(int *)(lVar1 + 0x11c) + -1) {
                iVar20 = 0x20;
              }
              fputc(iVar20,*(FILE **)(MshIdx + 0x300410));
              if (pvVar25 == (void *)0x0) {
                uVar16 = uVar6;
                if (pvVar10 != (void *)0x0) {
                  uVar16 = *(ulong *)((long)pvVar10 + uVar6 * 8);
                }
              }
              else {
                uVar16 = (long)*(int *)((long)pvVar25 + uVar6 * 4);
              }
              local_6d98[lVar24] = local_1f78[lVar24] + uVar16 * local_3eb8[lVar24];
              lVar24 = lVar24 + 1;
            } while (lVar24 < *(int *)(lVar1 + 0x11c));
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 <= uVar2);
      }
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

int GmfSetBlock(  int64_t MshIdx, int KwdCod, int64_t BegIdx, int64_t EndIdx,
                  int MapTyp, void *MapTab, void *prc, ... )
{
   char        *UsrDat[ GmfMaxTyp ], *UsrBas[ GmfMaxTyp ];
   char        *StrTab[4] = {"%.9g", "%.17g", "%d", "%lld" }, *FilPos;
   char        *FilBuf = NULL, *FrtBuf = NULL, *BckBuf = NULL;
   char        **BegTab, **EndTab, *BegUsrDat, *EndUsrDat;
   int         i, j, *FilPtrI32, *UsrPtrI32, FilTyp[ GmfMaxTyp ];
   int         UsrTyp[ GmfMaxTyp ], TypSiz[4] = {4,8,4,8};
   int         err, *IntMapTab = NULL, typ, mod = GmfArgLst;
   int         *TypTab, *SizTab, IniFlg = 1, TotSiz = 0, VecCnt, ArgCnt = 0;
   float       *FilPtrR32, *UsrPtrR32;
   double      *FilPtrR64, *UsrPtrR64;
   int64_t     UsrNmbLin, BlkNmbLin = 0, BlkBegIdx, BlkEndIdx = 0;
   int64_t     *FilPtrI64, *UsrPtrI64, *LngMapTab = NULL, OldIdx = 0;
   size_t      FilBegIdx = BegIdx, FilEndIdx = EndIdx;
   void        (*UsrPrc)(int64_t, int64_t, void *) = NULL;
   size_t      UsrLen[ GmfMaxTyp ], ret, LinSiz, VecLen, s, b, NmbBlk;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd = &msh->KwdTab[ KwdCod ];
   struct      aiocb aio;
   char        *UsrArg = NULL;

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      if(FilBuf)
         free(FilBuf);

      return(0);
   }

   // Check mesh and keyword
   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) || !kwd->NmbLin )
      return(0);

   // Make sure it's not a simple information keyword
   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      return(0);

   // Temporarily overwright the given begin and end values
   // as arbitrary position block write is not yet implemented
   FilBegIdx = 1;
   FilEndIdx = kwd->NmbLin;

   // Check user's bounds
   if( (FilBegIdx < 1) || (FilBegIdx > FilEndIdx) || (FilEndIdx > (size_t)kwd->NmbLin) )
      return(0);

   // Compute the number of lines to be written
   UsrNmbLin = FilEndIdx - FilBegIdx + 1;

   // Get the renumbering map if any
   if(MapTyp == GmfInt)
      IntMapTab = (int *)MapTab;
   else if(MapTyp == GmfLong)
      LngMapTab = (int64_t *)MapTab;

   // Start decoding the arguments
   va_start(VarArg, prc);
   LinSiz = 0;

   // Get the user's postprocessing procedure and argument adresses, if any
   if(prc)
   {
      UsrPrc = (void (*)(int64_t, int64_t, void *))prc;
      UsrArg = va_arg(VarArg, void *);
   }

   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      longjmp(msh->err, -42);

   // Read the first data type to select between list and table mode
   typ = va_arg(VarArg, int);

   // If the table mode is selected, read the four additional tables
   // containing the arguments: type, vector size, begin and end pointers
   if(typ == GmfArgTab)
   {
      mod = GmfArgTab;
      TypTab = va_arg(VarArg, int *);
      SizTab = va_arg(VarArg, int *);
      BegTab = va_arg(VarArg, char **);
      EndTab = va_arg(VarArg, char **);
   }

   // Read the arguments until to total size reaches the keyword's size
   while(TotSiz < kwd->SolSiz)
   {
      // In list mode all arguments are read from the variable argument buffer
      if(mod == GmfArgLst)
      {
         // Do not read the type argument for the first iteration because
         // it was read befeore the loop begins to get the argument mode
         if(IniFlg)
            IniFlg = 0;
         else
            typ = va_arg(VarArg, int);

         // In case the type is a vector. get its size and change the type
         // for the corresponding scalar type
         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            typ -= 4;
            VecCnt = va_arg(VarArg, int);
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            //  to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = va_arg(VarArg, char *);
         EndUsrDat = va_arg(VarArg, char *);
      }
      else
      {
         // Do exactly the same as above but the arguments are read from
         // the tables instead of VarArgs
         typ = TypTab[ ArgCnt ];

         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            typ -= 4;
            VecCnt = SizTab[ ArgCnt ];
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            // to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = (char *)BegTab[ ArgCnt ];
         EndUsrDat = (char *)EndTab[ ArgCnt ];
         ArgCnt++;
      }

      if(UsrNmbLin > 1)
      {
         VecLen = EndUsrDat - BegUsrDat;
         VecLen /= UsrNmbLin - 1;
      }
      else
         VecLen = 0;

      // Compute the consecutive begin / end adresses for vector data types
      for(i=0;i<VecCnt;i++)
      {
         UsrTyp[ TotSiz ]  = typ;
         UsrBas[ TotSiz ]  = BegUsrDat + i * TypSiz[ typ - GmfFloat ];
         UsrDat[ TotSiz ]  = UsrBas[ TotSiz ];
         UsrLen[ TotSiz ]  = VecLen;
         TotSiz++;
      }
   }

   // Get the file's data type
   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'r')
         if(msh->FltSiz == 32)
            FilTyp[i] = GmfFloat;
         else
            FilTyp[i] = GmfDouble;
      else
         if(msh->ver <= 3)
            FilTyp[i] = GmfInt;
         else
            FilTyp[i] = GmfLong;

      // Compute the file stride
      LinSiz += TypSiz[ FilTyp[i] - GmfFloat ];
   }

   va_end(VarArg);

   // Write the whole kwd data
   if(msh->typ & Asc)
   {
      if(UsrPrc)
         UsrPrc(1, kwd->NmbLin, UsrArg);

      for(s=FilBegIdx; s<=FilEndIdx; s++)
         for(j=0;j<kwd->SolSiz;j++)
         {
            if(UsrTyp[j] == GmfFloat)
            {
               UsrPtrR32 = (float *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], (double)*UsrPtrR32);
            }
            else if(UsrTyp[j] == GmfDouble)
            {
               UsrPtrR64 = (double *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], *UsrPtrR64);
            }
            else if(UsrTyp[j] == GmfInt)
            {
               UsrPtrI32 = (int *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], *UsrPtrI32);
            }
            else if(UsrTyp[j] == GmfLong)
            {
               UsrPtrI64 = (int64_t *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], *UsrPtrI64);
            }

            if(j < kwd->SolSiz -1)
               fprintf(msh->hdl, " ");
            else
               fprintf(msh->hdl, "\n");

            //UsrDat[j] += UsrLen[j];
            if(IntMapTab)
               UsrDat[j] = UsrBas[j] + IntMapTab[s] * UsrLen[j];
            else if(LngMapTab)
               UsrDat[j] = UsrBas[j] + LngMapTab[s] * UsrLen[j];
            else
               UsrDat[j] = UsrBas[j] + s * UsrLen[j];
         }
   }
   else
   {
      // Allocate the front and back buffers
      if(!(BckBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -43);

      if(!(FrtBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -44);

      // Setup the asynchronous parameters
      memset(&aio, 0, sizeof(struct aiocb));
      FilBuf = BckBuf;
#ifdef WITH_GMF_AIO
      aio.aio_fildes = msh->FilDes;
#else
      aio.aio_fildes = msh->hdl;
#endif
      aio.aio_offset = (size_t)GetFilPos(msh);

      NmbBlk = UsrNmbLin / BufSiz;

      // Loop over N+1 blocks
      for(b=0;b<=NmbBlk+1;b++)
      {
         // Launch an asynchronous block write
         // except for the first loop iteration
         if(b)
         {
            aio.aio_nbytes = BlkNmbLin * LinSiz;
            
            if(my_aio_write(&aio) == -1)
            {
#ifdef WITH_GMF_AIO
               printf("aio_fildes = %d\n",aio.aio_fildes);
#else
               printf("aio_fildes = %p\n",aio.aio_fildes);
#endif
               printf("aio_buf    = %p\n",aio.aio_buf);
               printf("aio_offset = " INT64_T_FMT "\n",(int64_t)aio.aio_offset);
               printf("aio_nbytes = " INT64_T_FMT "\n",(int64_t)aio.aio_nbytes);
               printf("errno      = %d\n",errno);
               longjmp(msh->err, -45);
            }
         }

         // Parse the block data except at the last loop iteration
         if(b<=NmbBlk)
         {
            // The last block is shorter
            if(b == NmbBlk)
               BlkNmbLin = UsrNmbLin - b * BufSiz;
            else
               BlkNmbLin = BufSiz;

            FilPos = FilBuf;
            BlkBegIdx = BlkEndIdx+1;
            BlkEndIdx += BlkNmbLin;

            // Call user's preprocessing first
            if(UsrPrc)
               UsrPrc(BlkBegIdx, BlkEndIdx, UsrArg);

            // Then copy it's data to the file buffer
            for(i=0;i<BlkNmbLin;i++)
            {
               OldIdx++;

               for(j=0;j<kwd->SolSiz;j++)
               {
                  if(IntMapTab)
                     UsrDat[j] = UsrBas[j] + (IntMapTab[ OldIdx ] - 1) * UsrLen[j];
                  else if(LngMapTab)
                     UsrDat[j] = UsrBas[j] + (LngMapTab[ OldIdx ] - 1) * UsrLen[j];
                  else
                     UsrDat[j] = UsrBas[j] + (OldIdx - 1) * UsrLen[j];

                  if(FilTyp[j] == GmfInt)
                  {
                     FilPtrI32 = (int *)FilPos;

                     if(UsrTyp[j] == GmfInt)
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *FilPtrI32 = *UsrPtrI32;
                     }
                     else
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *FilPtrI32 = (int)*UsrPtrI64;
                     }
                  }
                  else if(FilTyp[j] == GmfLong)
                  {
                     FilPtrI64 = (int64_t *)FilPos;

                     if(UsrTyp[j] == GmfLong)
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *FilPtrI64 = *UsrPtrI64;
                     }
                     else
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *FilPtrI64 = (int64_t)*UsrPtrI32;
                     }
                  }
                  else if(FilTyp[j] == GmfFloat)
                  {
                     FilPtrR32 = (float *)FilPos;

                     if(UsrTyp[j] == GmfFloat)
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *FilPtrR32 = *UsrPtrR32;
                     }
                     else
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *FilPtrR32 = (float)*UsrPtrR64;
                     }
                  }
                  else if(FilTyp[j] == GmfDouble)
                  {
                     FilPtrR64 = (double *)FilPos;

                     if(UsrTyp[j] == GmfDouble)
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *FilPtrR64 = *UsrPtrR64;
                     }
                     else
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *FilPtrR64 = (double)*UsrPtrR32;
                     }
                  }

                  FilPos += TypSiz[ FilTyp[j] - GmfFloat ];
               }
            }
         }

         // Wait for write completion execpt at the first loop iteration
         if(b)
         {
            while(my_aio_error(&aio) == EINPROGRESS);

            err = my_aio_error(&aio);
            ret = my_aio_return(&aio);

            if (err != 0) {
              printf (" Error at aio_error() : %s\n", strerror (err));
              longjmp(msh->err, -46);
            }

            if (ret != aio.aio_nbytes) {
              printf(" Error at aio_return()\n");
              longjmp(msh->err, -47);
            }

            // Move the write position
            aio.aio_offset += (size_t)aio.aio_nbytes;
         }

         // Swap the buffers
         if(FilBuf == BckBuf)
         {
            aio.aio_buf = BckBuf;
            FilBuf = FrtBuf;
         }
         else
         {
            aio.aio_buf = FrtBuf;
            FilBuf = BckBuf;
         }
      }

      SetFilPos(msh, aio.aio_offset);
      free(BckBuf);
      free(FrtBuf);
   }

   return(1);
}